

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O2

PrimMeta * tinyusdz::EmptyStaticMeta::GetEmptyStaticMeta(void)

{
  PrimMetas *this;
  
  if (s_meta == (PrimMetas *)0x0) {
    this = (PrimMetas *)operator_new(0x3f8);
    memset(this,0,0x3f8);
    PrimMetas::PrimMetas(this);
    s_meta = this;
  }
  return s_meta;
}

Assistant:

static PrimMeta &GetEmptyStaticMeta() {
    if (!s_meta) {
      s_meta = new PrimMeta();
    }

    return *s_meta;
  }